

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::enterModal
          (QGraphicsScenePrivate *this,QGraphicsItem *panel,PanelModality previousModality)

{
  PanelModality PVar1;
  QGraphicsItemPrivate *pQVar2;
  long *plVar3;
  QGraphicsItem *this_00;
  bool bVar4;
  QEvent *event;
  long lVar5;
  QGraphicsItem **item_1;
  QGraphicsItem **ppQVar6;
  QGraphicsItem **item;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QSet<QGraphicsItem_*> local_78;
  undefined1 *puStack_70;
  QArrayDataPointer<QGraphicsItem_*> local_68;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_48;
  QGraphicsItem *panel_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)&this->field_0x8;
  pQVar2 = (panel->d_ptr).d;
  PVar1 = pQVar2->panelModality;
  if (previousModality != NonModal) {
    pQVar2->panelModality = previousModality;
  }
  local_48.d = (Data *)0x0;
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  plVar3 = *(long **)(*(long *)(lVar5 + 8) + 0x88);
  panel_local = panel;
  (**(code **)(*plVar3 + 0x60))(&local_68,plVar3,1);
  ppQVar6 = local_68.ptr;
  for (lVar7 = local_68.size << 3; lVar7 != 0; lVar7 = lVar7 + -8) {
    bVar4 = QGraphicsItem::isPanel(*ppQVar6);
    if (bVar4) {
      bVar4 = QGraphicsItem::isBlockedByModalPanel(*ppQVar6,(QGraphicsItem **)0x0);
      if (bVar4) {
        QSet<QGraphicsItem_*>::insert(&local_78,(QGraphicsItem **)&local_48);
      }
    }
    ppQVar6 = ppQVar6 + 1;
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_68);
  if (previousModality != NonModal) {
    ((panel->d_ptr).d)->panelModality = PVar1;
    QtPrivate::sequential_erase_with_copy<QList<QGraphicsItem*>,QGraphicsItem*>
              (&this->modalPanels,&panel_local);
    panel = panel_local;
  }
  QList<QGraphicsItem_*>::prepend(&this->modalPanels,panel);
  if ((this->hoverItems).d.size != 0) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)&local_68,None);
    QGraphicsSceneHoverEvent::setScenePos
              ((QGraphicsSceneHoverEvent *)&local_68,&this->lastSceneMousePos);
    dispatchHoverEvent(this,(QGraphicsSceneHoverEvent *)&local_68);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_68);
  }
  lVar7 = (this->mouseGrabberItems).d.size;
  if ((lVar7 != 0) && ((this->field_0xb9 & 8) != 0)) {
    this_00 = (this->mouseGrabberItems).d.ptr[lVar7 + -1];
    bVar4 = QGraphicsItem::isBlockedByModalPanel(this_00,(QGraphicsItem **)0x0);
    if (bVar4) {
      ungrabMouse(this,this_00,false);
    }
  }
  local_78.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_78,WindowBlocked);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_88,WindowUnblocked);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  plVar3 = *(long **)(*(long *)(lVar5 + 8) + 0x88);
  (**(code **)(*plVar3 + 0x60))(&local_68,plVar3,1);
  lVar5 = local_68.size << 3;
  ppQVar6 = local_68.ptr;
  do {
    if (lVar5 == 0) {
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_68);
      QEvent::~QEvent((QEvent *)&local_88);
      QEvent::~QEvent((QEvent *)&local_78);
      QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    bVar4 = QGraphicsItem::isPanel(*ppQVar6);
    if (bVar4) {
      bVar4 = QHash<QGraphicsItem_*,_QHashDummyValue>::contains(&local_48,ppQVar6);
      if (bVar4) {
LAB_005982b3:
        bVar4 = QHash<QGraphicsItem_*,_QHashDummyValue>::contains(&local_48,ppQVar6);
        if (bVar4) {
          bVar4 = QGraphicsItem::isBlockedByModalPanel(*ppQVar6,(QGraphicsItem **)0x0);
          event = (QEvent *)&local_88;
          if (!bVar4) goto LAB_005982d4;
        }
      }
      else {
        bVar4 = QGraphicsItem::isBlockedByModalPanel(*ppQVar6,(QGraphicsItem **)0x0);
        event = (QEvent *)&local_78;
        if (!bVar4) goto LAB_005982b3;
LAB_005982d4:
        sendEvent(this,*ppQVar6,event);
      }
    }
    ppQVar6 = ppQVar6 + 1;
    lVar5 = lVar5 + -8;
  } while( true );
}

Assistant:

void QGraphicsScenePrivate::enterModal(QGraphicsItem *panel, QGraphicsItem::PanelModality previousModality)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(panel && panel->isPanel());

    QGraphicsItem::PanelModality panelModality = panel->d_ptr->panelModality;
    if (previousModality != QGraphicsItem::NonModal) {
        // the panel is changing from one modality type to another... temporarily set it back so
        // that blockedPanels is populated correctly
        panel->d_ptr->panelModality = previousModality;
    }

    QSet<QGraphicsItem *> blockedPanels;
    {
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && item->isBlockedByModalPanel())
                blockedPanels.insert(item);
        }
    }
    // blockedPanels contains all currently blocked panels

    if (previousModality != QGraphicsItem::NonModal) {
        // reset the modality to the proper value, since we changed it above
        panel->d_ptr->panelModality = panelModality;
        // remove this panel so that it will be reinserted at the front of the stack
        modalPanels.removeAll(panel);
    }

    modalPanels.prepend(panel);

    if (!hoverItems.isEmpty()) {
        // send GraphicsSceneHoverLeave events to newly blocked hoverItems
        QGraphicsSceneHoverEvent hoverEvent;
        hoverEvent.setScenePos(lastSceneMousePos);
        dispatchHoverEvent(&hoverEvent);
    }

    if (!mouseGrabberItems.isEmpty() && lastMouseGrabberItemHasImplicitMouseGrab) {
        QGraphicsItem *item = mouseGrabberItems.constLast();
        if (item->isBlockedByModalPanel())
            ungrabMouse(item, /*itemIsDying =*/ false);
    }

    QEvent windowBlockedEvent(QEvent::WindowBlocked);
    QEvent windowUnblockedEvent(QEvent::WindowUnblocked);
    const auto items_ = q->items();
    for (const auto &item : items_) {
        if (item->isPanel()) {
            if (!blockedPanels.contains(item) && item->isBlockedByModalPanel()) {
                // send QEvent::WindowBlocked to newly blocked panels
                sendEvent(item, &windowBlockedEvent);
            } else if (blockedPanels.contains(item) && !item->isBlockedByModalPanel()) {
                // send QEvent::WindowUnblocked to unblocked panels when downgrading
                // a panel from SceneModal to PanelModal
                sendEvent(item, &windowUnblockedEvent);
            }
        }
    }
}